

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsBody.cpp
# Opt level: O2

shared_ptr<chrono::ChBody> __thiscall chrono::ChLoadBodyBody::GetBodyA(ChLoadBodyBody *this)

{
  shared_ptr<chrono::ChBody> sVar1;
  
  sVar1 = std::dynamic_pointer_cast<chrono::ChBody,chrono::ChLoadable>
                    ((shared_ptr<chrono::ChLoadable> *)this);
  sVar1.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<chrono::ChBody>)
         sVar1.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChBody> ChLoadBodyBody::GetBodyA() const {
    return std::dynamic_pointer_cast<ChBody>(this->loadables[0]);
}